

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeMemGetFileDescriptorFromIpcHandleExp
          (ze_context_handle_t hContext,ze_ipc_mem_handle_t ipcHandle,uint64_t *pHandle)

{
  ZEValidationEntryPoints *pZVar1;
  ze_ipc_mem_handle_t ipcHandle_00;
  size_type sVar2;
  uint64_t *puVar3;
  ze_result_t zVar4;
  element_type *this;
  reference ppvVar5;
  pointer this_00;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 local_198 [68];
  ze_result_t local_154;
  size_type sStack_150;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t local_104;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  ze_result_t driver_result;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  ze_result_t local_bc;
  undefined1 auStack_b8 [4];
  ze_result_t result_1;
  ze_result_t local_74;
  size_type sStack_70;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnMemGetFileDescriptorFromIpcHandleExp_t pfnGetFileDescriptorFromIpcHandleExp;
  allocator local_41;
  string local_40 [32];
  uint64_t *local_20;
  uint64_t *pHandle_local;
  ze_context_handle_t hContext_local;
  
  local_20 = pHandle;
  pHandle_local = (uint64_t *)hContext;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"zeMemGetFileDescriptorFromIpcHandleExp(hContext, ipcHandle, pHandle)",
             &local_41);
  loader::Logger::log_trace(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  numValHandlers = *(size_type *)(context + 0x420);
  if (numValHandlers == 0) {
    hContext_local._4_4_ =
         logAndPropagateResult
                   ("zeMemGetFileDescriptorFromIpcHandleExp",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    i = std::
        vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
        ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                *)(context + 0xd30));
    for (sStack_70 = 0; sStack_70 < i; sStack_70 = sStack_70 + 1) {
      ppvVar5 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_70);
      puVar3 = pHandle_local;
      pZVar1 = (*ppvVar5)->zeValidation;
      memcpy(auStack_b8,&ipcHandle,0x40);
      local_74 = (*pZVar1->_vptr_ZEValidationEntryPoints[0xc4])(pZVar1,puVar3,local_20);
      if (local_74 != ZE_RESULT_SUCCESS) {
        zVar4 = logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp",local_74);
        return zVar4;
      }
      local_74 = 0;
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      puVar3 = pHandle_local;
      memcpy(&stack0xffffffffffffff00,&ipcHandle,0x40);
      uVar16 = (undefined4)local_d0;
      uVar17 = (undefined4)((ulong)local_d0 >> 0x20);
      uVar18 = (undefined4)uStack_c8;
      uVar19 = (undefined4)((ulong)uStack_c8 >> 0x20);
      uVar12 = (undefined4)local_e0;
      uVar13 = (undefined4)((ulong)local_e0 >> 0x20);
      uVar14 = (undefined4)uStack_d8;
      uVar15 = (undefined4)((ulong)uStack_d8 >> 0x20);
      uVar8 = (undefined4)local_f0;
      uVar9 = (undefined4)((ulong)local_f0 >> 0x20);
      uVar10 = (undefined4)uStack_e8;
      uVar11 = (undefined4)((ulong)uStack_e8 >> 0x20);
      uVar6 = (undefined4)uStack_f8;
      uVar7 = (undefined4)((ulong)uStack_f8 >> 0x20);
      ipcHandle_00.data[8] = (char)uVar6;
      ipcHandle_00.data[9] = (char)((uint)uVar6 >> 8);
      ipcHandle_00.data[10] = (char)((uint)uVar6 >> 0x10);
      ipcHandle_00.data[0xb] = (char)((uint)uVar6 >> 0x18);
      ipcHandle_00.data[0] = uStack_100;
      ipcHandle_00.data[1] = uStack_ff;
      ipcHandle_00.data[2] = uStack_fe;
      ipcHandle_00.data[3] = uStack_fd;
      ipcHandle_00.data[4] = (undefined1)driver_result;
      ipcHandle_00.data[5] = driver_result._1_1_;
      ipcHandle_00.data[6] = driver_result._2_1_;
      ipcHandle_00.data[7] = driver_result._3_1_;
      ipcHandle_00.data[0xc] = (char)uVar7;
      ipcHandle_00.data[0xd] = (char)((uint)uVar7 >> 8);
      ipcHandle_00.data[0xe] = (char)((uint)uVar7 >> 0x10);
      ipcHandle_00.data[0xf] = (char)((uint)uVar7 >> 0x18);
      ipcHandle_00.data[0x10] = (char)uVar8;
      ipcHandle_00.data[0x11] = (char)((uint)uVar8 >> 8);
      ipcHandle_00.data[0x12] = (char)((uint)uVar8 >> 0x10);
      ipcHandle_00.data[0x13] = (char)((uint)uVar8 >> 0x18);
      ipcHandle_00.data[0x14] = (char)uVar9;
      ipcHandle_00.data[0x15] = (char)((uint)uVar9 >> 8);
      ipcHandle_00.data[0x16] = (char)((uint)uVar9 >> 0x10);
      ipcHandle_00.data[0x17] = (char)((uint)uVar9 >> 0x18);
      ipcHandle_00.data[0x18] = (char)uVar10;
      ipcHandle_00.data[0x19] = (char)((uint)uVar10 >> 8);
      ipcHandle_00.data[0x1a] = (char)((uint)uVar10 >> 0x10);
      ipcHandle_00.data[0x1b] = (char)((uint)uVar10 >> 0x18);
      ipcHandle_00.data[0x1c] = (char)uVar11;
      ipcHandle_00.data[0x1d] = (char)((uint)uVar11 >> 8);
      ipcHandle_00.data[0x1e] = (char)((uint)uVar11 >> 0x10);
      ipcHandle_00.data[0x1f] = (char)((uint)uVar11 >> 0x18);
      ipcHandle_00.data[0x20] = (char)uVar12;
      ipcHandle_00.data[0x21] = (char)((uint)uVar12 >> 8);
      ipcHandle_00.data[0x22] = (char)((uint)uVar12 >> 0x10);
      ipcHandle_00.data[0x23] = (char)((uint)uVar12 >> 0x18);
      ipcHandle_00.data[0x24] = (char)uVar13;
      ipcHandle_00.data[0x25] = (char)((uint)uVar13 >> 8);
      ipcHandle_00.data[0x26] = (char)((uint)uVar13 >> 0x10);
      ipcHandle_00.data[0x27] = (char)((uint)uVar13 >> 0x18);
      ipcHandle_00.data[0x28] = (char)uVar14;
      ipcHandle_00.data[0x29] = (char)((uint)uVar14 >> 8);
      ipcHandle_00.data[0x2a] = (char)((uint)uVar14 >> 0x10);
      ipcHandle_00.data[0x2b] = (char)((uint)uVar14 >> 0x18);
      ipcHandle_00.data[0x2c] = (char)uVar15;
      ipcHandle_00.data[0x2d] = (char)((uint)uVar15 >> 8);
      ipcHandle_00.data[0x2e] = (char)((uint)uVar15 >> 0x10);
      ipcHandle_00.data[0x2f] = (char)((uint)uVar15 >> 0x18);
      ipcHandle_00.data[0x30] = (char)uVar16;
      ipcHandle_00.data[0x31] = (char)((uint)uVar16 >> 8);
      ipcHandle_00.data[0x32] = (char)((uint)uVar16 >> 0x10);
      ipcHandle_00.data[0x33] = (char)((uint)uVar16 >> 0x18);
      ipcHandle_00.data[0x34] = (char)uVar17;
      ipcHandle_00.data[0x35] = (char)((uint)uVar17 >> 8);
      ipcHandle_00.data[0x36] = (char)((uint)uVar17 >> 0x10);
      ipcHandle_00.data[0x37] = (char)((uint)uVar17 >> 0x18);
      ipcHandle_00.data[0x38] = (char)uVar18;
      ipcHandle_00.data[0x39] = (char)((uint)uVar18 >> 8);
      ipcHandle_00.data[0x3a] = (char)((uint)uVar18 >> 0x10);
      ipcHandle_00.data[0x3b] = (char)((uint)uVar18 >> 0x18);
      ipcHandle_00.data[0x3c] = (char)uVar19;
      ipcHandle_00.data[0x3d] = (char)((uint)uVar19 >> 8);
      ipcHandle_00.data[0x3e] = (char)((uint)uVar19 >> 0x10);
      ipcHandle_00.data[0x3f] = (char)((uint)uVar19 >> 0x18);
      local_bc = ZEHandleLifetimeValidation::zeMemGetFileDescriptorFromIpcHandleExpPrologue
                           (&this_00->zeHandleLifetime,(ze_context_handle_t)puVar3,ipcHandle_00,
                            local_20);
      if (local_bc != ZE_RESULT_SUCCESS) {
        zVar4 = logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp",local_bc);
        return zVar4;
      }
      local_bc = 0;
    }
    puVar3 = pHandle_local;
    sVar2 = numValHandlers;
    memcpy(&i_1,&ipcHandle,0x40);
    local_104 = (*(code *)sVar2)(puVar3,local_20);
    for (sStack_150 = 0; sStack_150 < i; sStack_150 = sStack_150 + 1) {
      ppvVar5 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_150);
      puVar3 = pHandle_local;
      pZVar1 = (*ppvVar5)->zeValidation;
      memcpy(local_198,&ipcHandle,0x40);
      local_154 = (*pZVar1->_vptr_ZEValidationEntryPoints[0xc5])
                            (pZVar1,puVar3,local_20,(ulong)local_104);
      if (local_154 != ZE_RESULT_SUCCESS) {
        zVar4 = logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp",local_154);
        return zVar4;
      }
      local_154 = 0;
    }
    hContext_local._4_4_ = logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp",local_104)
    ;
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetFileDescriptorFromIpcHandleExp(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_ipc_mem_handle_t ipcHandle,                  ///< [in] IPC memory handle
        uint64_t* pHandle                               ///< [out] Returned file descriptor
        )
    {
        context.logger->log_trace("zeMemGetFileDescriptorFromIpcHandleExp(hContext, ipcHandle, pHandle)");

        auto pfnGetFileDescriptorFromIpcHandleExp = context.zeDdiTable.MemExp.pfnGetFileDescriptorFromIpcHandleExp;

        if( nullptr == pfnGetFileDescriptorFromIpcHandleExp )
            return logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemGetFileDescriptorFromIpcHandleExpPrologue( hContext, ipcHandle, pHandle );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemGetFileDescriptorFromIpcHandleExpPrologue( hContext, ipcHandle, pHandle );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp", result);
        }

        auto driver_result = pfnGetFileDescriptorFromIpcHandleExp( hContext, ipcHandle, pHandle );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemGetFileDescriptorFromIpcHandleExpEpilogue( hContext, ipcHandle, pHandle ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
        }
        return logAndPropagateResult("zeMemGetFileDescriptorFromIpcHandleExp", driver_result);
    }